

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_drop_modules(sqlite3 *db,char **azNames)

{
  int iVar1;
  sqlite3 *in_RSI;
  long in_RDI;
  int ii;
  Module *pMod;
  HashElem *pNext;
  HashElem *pThis;
  uint in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr *pAux;
  sqlite3_module *pModule;
  sqlite3_module *zName;
  
  pModule = *(sqlite3_module **)(in_RDI + 0x228);
LAB_00146d61:
  zName = pModule;
  if (zName == (sqlite3_module *)0x0) {
    return 0;
  }
  pAux = zName->xConnect;
  pModule = *(sqlite3_module **)zName;
  if (in_RSI != (sqlite3 *)0x0) goto code_r0x00146d90;
  goto LAB_00146e0b;
code_r0x00146d90:
  in_stack_ffffffffffffffd4 = 0;
  while( true ) {
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 & 0xffffff;
    if ((&in_RSI->pVfs)[in_stack_ffffffffffffffd4] != (sqlite3_vfs *)0x0) {
      iVar1 = strcmp((char *)(&in_RSI->pVfs)[in_stack_ffffffffffffffd4],*(char **)(pAux + 8));
      in_stack_ffffffffffffffd0 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffd0);
    }
    if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
  }
  if ((&in_RSI->pVfs)[in_stack_ffffffffffffffd4] == (sqlite3_vfs *)0x0) {
LAB_00146e0b:
    createModule(in_RSI,(char *)zName,pModule,pAux,
                 (_func_void_void_ptr *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  goto LAB_00146d61;
}

Assistant:

SQLITE_API int sqlite3_drop_modules(sqlite3 *db, const char** azNames){
  HashElem *pThis, *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  for(pThis=sqliteHashFirst(&db->aModule); pThis; pThis=pNext){
    Module *pMod = (Module*)sqliteHashData(pThis);
    pNext = sqliteHashNext(pThis);
    if( azNames ){
      int ii;
      for(ii=0; azNames[ii]!=0 && strcmp(azNames[ii],pMod->zName)!=0; ii++){}
      if( azNames[ii]!=0 ) continue;
    }
    createModule(db, pMod->zName, 0, 0, 0);
  }
  return SQLITE_OK;
}